

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

ConvertedFunction * __thiscall
dxil_spv::Converter::Impl::convert_entry_point(ConvertedFunction *__return_storage_ptr__,Impl *this)

{
  Vector<Function> *leaves;
  undefined1 uVar1;
  size_type sVar2;
  CFGNodePool *pool;
  SPIRVModule *this_00;
  undefined8 __p;
  bool bVar3;
  ExecutionModel EVar4;
  int iVar5;
  Module *module;
  MDNode *pMVar6;
  Builder *this_01;
  LoggingCallback p_Var7;
  Function *pFVar8;
  MDOperand *md;
  MDString *pMVar9;
  void *pvVar10;
  CFGNode *entry;
  Function *pFVar11;
  uint index;
  CFGNodePool *pCVar12;
  uint32_t version;
  char *entry_00;
  Function FVar13;
  Vector<LLVMBC::BasicBlock_*> visit_order;
  Vector<LLVMBC::BasicBlock_*> patch_visit_order;
  char buffer [4096];
  
  (__return_storage_ptr__->leaf_functions).
  super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->node_pool)._M_t.
  super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>._M_t.
  super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>.
  super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl = (CFGNodePool *)0x0;
  (__return_storage_ptr__->leaf_functions).
  super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->leaf_functions).
  super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->entry).entry = (CFGNode *)0x0;
  (__return_storage_ptr__->entry).func = (Function *)0x0;
  module = LLVMBCParser::get_module(this->bitcode_parser);
  entry_00 = (char *)(this->options).entry_point._M_string_length;
  if (entry_00 != (char *)0x0) {
    entry_00 = (this->options).entry_point._M_dataplus._M_p;
  }
  pMVar6 = get_entry_point_meta(module,entry_00);
  this->entry_point_meta = pMVar6;
  EVar4 = get_execution_model(module,pMVar6);
  this->execution_model = EVar4;
  buffer._0_8_ = buffer + 0x10;
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  buffer._16_8_ = buffer._16_8_ & 0xffffffffffffff00;
  get_shader_model(module,(basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                           *)buffer,(uint32_t *)0x0,(uint32_t *)0x0);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                           *)buffer,"lib");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             buffer);
  this->execution_model_lib_target = bVar3;
  version = 0x10600;
  if (bVar3 && this->execution_model == ExecutionModelGLCompute) {
LAB_0010cf62:
    SPIRVModule::set_override_spirv_version(this->spirv_module,version);
  }
  else if ((this->execution_model == ExecutionModelFragment) &&
          (this->resource_mapping_iface != (ResourceRemappingInterface *)0x0)) {
    iVar5 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[0xc])();
    version = 0x10400;
    if ((char)iVar5 != '\0') goto LAB_0010cf62;
  }
  if (this->entry_point_meta == (MDNode *)0x0) {
    sVar2 = (this->options).entry_point._M_string_length;
    p_Var7 = get_thread_log_callback();
    if (sVar2 == 0) {
      if (p_Var7 == (LoggingCallback)0x0) {
        fwrite("[ERROR]: Could not find any entry point.\n",0x29,1,_stderr);
        goto LAB_0010d2f6;
      }
      builtin_strncpy(buffer + 0x10,"ny entry point.\n",0x11);
      builtin_strncpy(buffer,"Could not find a",0x10);
    }
    else {
      if (p_Var7 == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Could not find entry point \"%s\".\n",
                (this->options).entry_point._M_dataplus._M_p);
LAB_0010d2f6:
        fflush(_stderr);
        return __return_storage_ptr__;
      }
      snprintf(buffer,0x1000,"Could not find entry point \"%s\".\n",
               (this->options).entry_point._M_dataplus._M_p);
    }
    pvVar10 = get_thread_log_callback_userdata();
    (*p_Var7)(pvVar10,Error,buffer);
    return __return_storage_ptr__;
  }
  if ((this->options).shader_source_file._M_string_length != 0) {
    this_01 = SPIRVModule::get_builder(this->spirv_module);
    buffer._0_8_ = buffer._0_8_ & 0xffffffff00000000;
    visit_order.
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    get_shader_model(module,(String *)0x0,(uint32_t *)buffer,(uint32_t *)&visit_order);
    this_01->source = SourceLanguageUnknown;
    this_01->sourceVersion =
         buffer._0_4_ * 100 +
         (int)visit_order.
              super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    spv::Builder::setSourceFile(this_01,&(this->options).shader_source_file);
  }
  std::make_unique<dxil_spv::CFGNodePool>();
  __p = buffer._0_8_;
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  std::__uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>::reset
            ((__uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_> *)
             &__return_storage_ptr__->node_pool,(pointer)__p);
  std::unique_ptr<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>::~unique_ptr
            ((unique_ptr<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_> *)
             buffer);
  bVar3 = true;
  if ((this->options).physical_storage_buffer == false) {
    if (this->execution_model_lib_target == true) {
      bVar3 = this->execution_model == ExecutionModelGLCompute;
    }
    else {
      bVar3 = false;
    }
  }
  pool = (__return_storage_ptr__->node_pool)._M_t.
         super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>.
         _M_t.
         super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>
         .super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl;
  SPIRVModule::set_descriptor_qa_info(this->spirv_module,&(this->options).descriptor_qa);
  if ((this->options).min_precision_prefer_native_16bit == false) {
    uVar1 = (this->execution_mode_meta).native_16bit_operations;
  }
  else {
    uVar1 = true;
  }
  (this->options).instruction_instrumentation.fp16 = (bool)uVar1;
  SPIRVModule::set_instruction_instrumentation_info
            (this->spirv_module,&(this->options).instruction_instrumentation);
  this_00 = this->spirv_module;
  EVar4 = get_execution_model(module,this->entry_point_meta);
  SPIRVModule::emit_entry_point(this_00,EVar4,"main",bVar3);
  pFVar8 = get_entry_point_function(this->entry_point_meta);
  pCVar12 = pool;
  build_function_bb_visit_order_legacy(&visit_order,this,pFVar8,pool);
  index = (uint)pCVar12;
  patch_visit_order.
  super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  patch_visit_order.
  super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  patch_visit_order.
  super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = module_is_dxilconv(module);
  if (bVar3) {
    (this->options).min_precision_prefer_native_16bit = false;
  }
  analyze_execution_modes_meta(this);
  emit_resources_global_mapping(this);
  bVar3 = analyze_instructions(this,pFVar8);
  if ((!bVar3) || (bVar3 = emit_execution_modes(this), !bVar3)) goto LAB_0010d3b6;
  pFVar8 = (this->execution_mode_meta).patch_constant_function;
  if (pFVar8 != (Function *)0x0) {
    pCVar12 = pool;
    build_function_bb_visit_order_legacy((Vector<LLVMBC::BasicBlock_*> *)buffer,this,pFVar8,pool);
    index = (uint)pCVar12;
    std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
    _M_move_assign(&patch_visit_order,
                   (_Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                    *)buffer);
    std::_Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
    ~_Vector_base((_Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                   *)buffer);
    bVar3 = analyze_instructions(this,(this->execution_mode_meta).patch_constant_function);
    if (!bVar3) goto LAB_0010d3b6;
  }
  bVar3 = emit_resources(this);
  if ((((!bVar3) || (bVar3 = emit_stage_input_variables(this), !bVar3)) ||
      (bVar3 = emit_stage_output_variables(this), !bVar3)) ||
     (bVar3 = emit_patch_variables(this), !bVar3)) goto LAB_0010d3b6;
  emit_other_variables(this);
  bVar3 = emit_global_variables(this);
  if (!bVar3) goto LAB_0010d3b6;
  emit_execution_modes_late(this);
  analyze_instructions_post_execution_modes(this);
  pMVar6 = this->entry_point_meta;
  if (((pMVar6 == (MDNode *)0x0) || (md = LLVMBC::MDNode::getOperand(pMVar6,1), md->kind == None))
     || (pMVar9 = LLVMBC::dyn_cast<LLVMBC::MDString>(md), pMVar9 == (MDString *)0x0)) {
    buffer._0_8_ = (long)buffer + 0x10;
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    buffer._16_8_ = buffer._16_8_ & 0xffffffffffffff00;
  }
  else {
    get_string_metadata_abi_cxx11_((String *)buffer,(dxil_spv *)pMVar6,(MDNode *)0x1,index);
  }
  leaves = &__return_storage_ptr__->leaf_functions;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&(this->execution_mode_meta).entry_point_name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            buffer);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             buffer);
  if (this->execution_model == ExecutionModelTessellationControl) {
    FVar13 = build_hull_main(this,&visit_order,&patch_visit_order,pool,leaves);
LAB_0010d3a6:
    pFVar11 = FVar13.func;
    (__return_storage_ptr__->entry).entry = FVar13.entry;
  }
  else {
    if ((this->execution_mode_meta).declares_rov == true) {
      FVar13 = build_rov_main(this,&visit_order,pool,leaves);
      goto LAB_0010d3a6;
    }
    if ((this->execution_model == ExecutionModelGLCompute) &&
       (this->execution_model_lib_target != false)) {
      FVar13 = build_node_main(this,&visit_order,pool,leaves);
      goto LAB_0010d3a6;
    }
    entry = convert_function(this,&visit_order,true);
    (__return_storage_ptr__->entry).entry = entry;
    if (((this->shader_analysis).needs_auto_group_shared_barriers == true) &&
       ((this->options).quirks.group_shared_auto_barrier == true)) {
      CFGStructurizer::CFGStructurizer((CFGStructurizer *)buffer,entry,pool,this->spirv_module);
      CFGStructurizer::rewrite_auto_group_shared_barrier((CFGStructurizer *)buffer);
      CFGStructurizer::~CFGStructurizer((CFGStructurizer *)buffer);
    }
    if ((this->shader_analysis).require_subgroup_shuffles == true) {
      CFGStructurizer::CFGStructurizer
                ((CFGStructurizer *)buffer,(__return_storage_ptr__->entry).entry,pool,
                 this->spirv_module);
      CFGStructurizer::flatten_subgroup_shuffles((CFGStructurizer *)buffer);
      CFGStructurizer::~CFGStructurizer((CFGStructurizer *)buffer);
    }
    pFVar11 = SPIRVModule::get_entry_function(this->spirv_module);
  }
  (__return_storage_ptr__->entry).func = pFVar11;
  emit_execution_modes_post_code_generation(this);
LAB_0010d3b6:
  std::_Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
  ~_Vector_base(&patch_visit_order.
                 super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
               );
  std::_Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
  ~_Vector_base(&visit_order.
                 super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
               );
  return __return_storage_ptr__;
}

Assistant:

ConvertedFunction Converter::Impl::convert_entry_point()
{
	ConvertedFunction result = {};

	auto &module = bitcode_parser.get_module();
	entry_point_meta = get_entry_point_meta(module, options.entry_point.empty() ? nullptr : options.entry_point.c_str());
	execution_model = get_execution_model(module, entry_point_meta);
	execution_model_lib_target = get_execution_model_lib_target(module, entry_point_meta);

	if (execution_model_lib_target && execution_model == spv::ExecutionModelGLCompute)
	{
		// Might as well go with SPIR-V 1.6. Then we get subgroup size control semantics for "free".
		// When we're willing to do a clean break with Fossilize all shaders should target SPIR-V 1.6.
		spirv_module.set_override_spirv_version(0x10600);
	}
	else if (execution_model == spv::ExecutionModelFragment &&
	         resource_mapping_iface && resource_mapping_iface->has_nontrivial_stage_input_remapping())
	{
		// Force SPIR-V 1.4 for fragment shaders if we might end up requiring mesh shader capabilities.
		// Non-trivial stage input remapping may require PerPrimitiveEXT decoration.
		spirv_module.set_override_spirv_version(0x10400);
	}

	if (!entry_point_meta)
	{
		if (!options.entry_point.empty())
			LOGE("Could not find entry point \"%s\".\n", options.entry_point.c_str());
		else
			LOGE("Could not find any entry point.\n");
		return result;
	}

	if (!options.shader_source_file.empty())
	{
		auto &builder = spirv_module.get_builder();
		uint32_t sm_major = 0, sm_minor = 0;
		get_shader_model(module, nullptr, &sm_major, &sm_minor);
		builder.setSource(spv::SourceLanguageUnknown, sm_major * 100 + sm_minor);
		builder.setSourceFile(options.shader_source_file);
	}

	result.node_pool = std::make_unique<CFGNodePool>();
	auto &pool = *result.node_pool;

	bool need_bda =
		options.physical_storage_buffer ||
		(execution_model_lib_target &&
		 execution_model == spv::ExecutionModelGLCompute);

	spirv_module.set_descriptor_qa_info(options.descriptor_qa);
	options.instruction_instrumentation.fp16 =
	    options.min_precision_prefer_native_16bit || execution_mode_meta.native_16bit_operations;
	spirv_module.set_instruction_instrumentation_info(options.instruction_instrumentation);
	spirv_module.emit_entry_point(get_execution_model(module, entry_point_meta), "main", need_bda);

	llvm::Function *func = get_entry_point_function(entry_point_meta);
	auto visit_order = build_function_bb_visit_order_legacy(func, pool);
	Vector<llvm::BasicBlock *> patch_visit_order;

	// dxilconv emits somewhat broken code for min16float for resource access.
	// Just use FP32 here since that's what we've tested and avoids lots of awkward workarounds.
	if (module_is_dxilconv(module))
		options.min_precision_prefer_native_16bit = false;

	// Need to analyze some execution modes early which affect opcode analysis later.
	if (!analyze_execution_modes_meta())
		return result;
	if (!emit_resources_global_mapping())
		return result;
	if (!analyze_instructions(func))
		return result;

	if (!emit_execution_modes())
		return result;

	if (execution_mode_meta.patch_constant_function)
	{
		patch_visit_order = build_function_bb_visit_order_legacy(execution_mode_meta.patch_constant_function, pool);
		if (!analyze_instructions(execution_mode_meta.patch_constant_function))
			return result;
	}

	if (!emit_resources())
		return result;
	if (!emit_stage_input_variables())
		return result;
	if (!emit_stage_output_variables())
		return result;
	if (!emit_patch_variables())
		return result;
	if (!emit_other_variables())
		return result;
	if (!emit_global_variables())
		return result;

	// Some execution modes depend on other execution modes, so handle that here.
	if (!emit_execution_modes_late())
		return result;

	analyze_instructions_post_execution_modes();

	execution_mode_meta.entry_point_name = get_entry_point_name(entry_point_meta);

	if (execution_model == spv::ExecutionModelTessellationControl)
		result.entry = build_hull_main(visit_order, patch_visit_order, pool, result.leaf_functions);
	else if (execution_mode_meta.declares_rov)
		result.entry = build_rov_main(visit_order, pool, result.leaf_functions);
	else if (execution_model_lib_target && execution_model == spv::ExecutionModelGLCompute)
		result.entry = build_node_main(visit_order, pool, result.leaf_functions);
	else
	{
		result.entry.entry = convert_function(visit_order, true);
		if (shader_analysis.needs_auto_group_shared_barriers && options.quirks.group_shared_auto_barrier)
		{
			CFGStructurizer cfg{result.entry.entry, pool, spirv_module};
			cfg.rewrite_auto_group_shared_barrier();
		}

		if (shader_analysis.require_subgroup_shuffles)
		{
			CFGStructurizer cfg{result.entry.entry, pool, spirv_module};
			cfg.flatten_subgroup_shuffles();
		}

		result.entry.func = spirv_module.get_entry_function();
	}

	// Some execution modes depend on code generation, handle that here.
	emit_execution_modes_post_code_generation();

	return result;
}